

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O2

QSize __thiscall QPushButton::sizeHint(QPushButton *this)

{
  byte bVar1;
  long lVar2;
  undefined1 *puVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  QDialogButtonBox *pQVar7;
  QStyle *pQVar8;
  undefined8 uVar9;
  QMenu *pQVar10;
  QSize QVar11;
  int iVar12;
  int iVar13;
  Representation RVar14;
  longlong __tmp;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_100;
  QFontMetrics fm;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  Data *pDStack_60;
  char16_t *local_58;
  undefined1 *puStack_50;
  QIcon local_48;
  QSize QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if (((*(int *)(lVar2 + 0x2ac) < 0) || (*(int *)(lVar2 + 0x2b0) < 0)) ||
     (bVar1 = *(byte *)(lVar2 + 0x2c8), bVar4 = autoDefault(this), bVar4 == ((bVar1 & 0x40) == 0)))
  {
    bVar4 = autoDefault(this);
    *(byte *)(lVar2 + 0x2c8) = *(byte *)(lVar2 + 0x2c8) & 0xbf | bVar4 << 6;
    QWidget::ensurePolished((QWidget *)this);
    local_48.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_40 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    pDStack_60 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)local_a8);
    (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1b8))
              (this,(QStyleOptionButton *)local_a8);
    pQVar7 = QtPrivate::qobject_cast_helper<QDialogButtonBox*,QObject>
                       (*(QObject **)
                         (*(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8 + 0x10));
    if (pQVar7 == (QDialogButtonBox *)0x0) {
      bVar4 = false;
    }
    else {
      pQVar8 = QWidget::style((QWidget *)this);
      iVar6 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x47,0,this,0);
      bVar4 = iVar6 != 0;
    }
    QAbstractButton::icon((QAbstractButton *)local_c8);
    cVar5 = QIcon::isNull();
    QIcon::~QIcon((QIcon *)local_c8);
    if ((bVar4) || (iVar6 = 0, RVar14.m_i = 0, cVar5 == '\0')) {
      iVar6 = QStack_40.wd.m_i + 4;
      RVar14.m_i = 0;
      if (0 < QStack_40.ht.m_i) {
        RVar14.m_i = QStack_40.ht.m_i;
      }
    }
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractButton::text((QString *)local_c8,&this->super_QAbstractButton);
    puVar3 = local_b8;
    _fm = (QWidgetData *)local_c8._0_8_;
    if (local_b8 == (undefined1 *)0x0) {
      local_100.d = (Data *)0x0;
      local_100.ptr = (char16_t *)0x0;
      local_100.size = 0;
      local_c8._0_8_ = (QWidgetData *)0x0;
      local_c8._8_8_ = L"XXXX";
      local_b8 = (undefined1 *)0x4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fm);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_100);
    }
    _fm = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::fontMetrics((QWidget *)&fm);
    uVar9 = QFontMetrics::size((int)(QWidget *)&fm,(QString *)0x800,(int)local_c8,(int *)0x0);
    iVar13 = 0;
    if (iVar6 == 0) {
      iVar13 = (int)uVar9;
    }
    iVar12 = (int)((ulong)uVar9 >> 0x20);
    if (iVar12 < RVar14.m_i) {
      iVar12 = RVar14.m_i;
    }
    if (RVar14.m_i == 0) {
      RVar14.m_i = iVar12;
    }
    if (puVar3 != (undefined1 *)0x0) {
      RVar14.m_i = iVar12;
      iVar13 = (int)uVar9;
    }
    iVar13 = iVar13 + iVar6;
    puStack_90._0_4_ = (int)local_98 + -1 + iVar13;
    puStack_90._4_4_ = (int)((ulong)local_98 >> 0x20) + -1 + RVar14.m_i;
    pQVar10 = menu(this);
    if (pQVar10 != (QMenu *)0x0) {
      pQVar8 = QWidget::style((QWidget *)this);
      iVar6 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,2,local_a8,this);
      iVar13 = iVar6 + iVar13;
    }
    pQVar8 = QWidget::style((QWidget *)this);
    local_100.d = (Data *)CONCAT44(RVar14.m_i,iVar13);
    QVar11 = (QSize)(**(code **)(*(long *)pQVar8 + 0xe8))
                              (pQVar8,0,(QStyleOptionButton *)local_a8,&local_100,this);
    *(QSize *)(lVar2 + 0x2ac) = QVar11;
    QFontMetrics::~QFontMetrics(&fm);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
    QStyleOptionButton::~QStyleOptionButton((QStyleOptionButton *)local_a8);
  }
  else {
    QVar11 = *(QSize *)(lVar2 + 0x2ac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar11;
}

Assistant:

QSize QPushButton::sizeHint() const
{
    Q_D(const QPushButton);
    if (d->sizeHint.isValid() && d->lastAutoDefault == autoDefault())
        return d->sizeHint;
    d->lastAutoDefault = autoDefault();
    ensurePolished();

    int w = 0, h = 0;

    QStyleOptionButton opt;
    initStyleOption(&opt);

    // calculate contents size...
#if !defined(QT_NO_ICON) && QT_CONFIG(dialogbuttonbox)
    bool showButtonBoxIcons = qobject_cast<QDialogButtonBox*>(parentWidget())
                          && style()->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, this);

    if (!icon().isNull() || showButtonBoxIcons) {
        int ih = opt.iconSize.height();
        int iw = opt.iconSize.width() + 4;
        w += iw;
        h = qMax(h, ih);
    }
#endif
    QString s(text());
    bool empty = s.isEmpty();
    if (empty)
        s = QStringLiteral("XXXX");
    QFontMetrics fm = fontMetrics();
    QSize sz = fm.size(Qt::TextShowMnemonic, s);
    if (!empty || !w)
        w += sz.width();
    if (!empty || !h)
        h = qMax(h, sz.height());
    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
#if QT_CONFIG(menu)
    if (menu())
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);
#endif
    d->sizeHint = style()->sizeFromContents(QStyle::CT_PushButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}